

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Text __thiscall loguru::stacktrace(loguru *this,int skip)

{
  char *pcVar1;
  int in_EDX;
  undefined1 local_38 [8];
  string str;
  int skip_local;
  
  str.field_2._12_4_ = skip;
  stacktrace_as_stdstring_abi_cxx11_((string *)local_38,(loguru *)(ulong)(skip + 1),in_EDX);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  Text::Text((Text *)this,pcVar1);
  std::__cxx11::string::~string((string *)local_38);
  return (Text)(char *)this;
}

Assistant:

Text stacktrace(int skip)
	{
		auto str = stacktrace_as_stdstring(skip + 1);
		return Text(STRDUP(str.c_str()));
	}